

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void ParsePhdr(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  int iVar1;
  SFPreset *name;
  undefined8 uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)chunklen / 0x26;
  if ((0x4b < chunklen) && (chunklen % 0x26 == 0)) {
    sf2->NumPresets = (int)uVar3;
    name = (SFPreset *)operator_new__((ulong)(uint)((int)uVar3 * 0x1c));
    sf2->Presets = name;
    while( true ) {
      iVar1 = (int)uVar3;
      uVar3 = (ulong)(iVar1 - 1);
      if (iVar1 == 0) {
        return;
      }
      read_name(f,name->Name);
      iVar1 = read_uword(f);
      name->Program = (WORD)iVar1;
      iVar1 = read_uword(f);
      name->Bank = (WORD)iVar1;
      iVar1 = read_uword(f);
      name->BagIndex = (WORD)iVar1;
      skip_chunk(f,0xc);
      if ((name != sf2->Presets) && (name->BagIndex < name[-1].BagIndex)) break;
      name = name + 1;
    }
  }
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&CBadForm::typeinfo,0);
}

Assistant:

static void ParsePhdr(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	SFPreset *preset;

	// Section 7.2, page 22:
	//		If the PHDR sub-chunk is missing, or contains fewer than two records,
	//		or its size is not a multiple of 38 bytes, the file should be rejected
	//		as structurally unsound.
	if (chunklen < 38*2 || chunklen % 38 != 0)
	{
		throw CBadForm();
	}

	sf2->NumPresets = chunklen / 38;
	sf2->Presets = new SFPreset[sf2->NumPresets];
	preset = sf2->Presets;

	for (int i = sf2->NumPresets; i != 0; --i, ++preset)
	{
		read_name(f, preset->Name);
		preset->Program = read_uword(f);
		preset->Bank = read_uword(f);
		preset->BagIndex = read_uword(f);
		skip_chunk(f, 4*3);	// Skip library, genre, and morphology

		// Section 7.2, page 22:
		//		The preset bag indices will be monotonically increasing with
		//		increasing preset headers.
		if (preset != sf2->Presets)
		{
			if (preset->BagIndex < (preset - 1)->BagIndex)
			{
				throw CBadForm();
			}
		}
	}
}